

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O0

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  WebData in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype in_XMM0_Qa;
  WebData wdata;
  sunrealtype *cBdotdata;
  sunrealtype *cBdata;
  sunrealtype *cdata;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype *fBsave;
  sunrealtype *fsave;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype y;
  sunrealtype x;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype dcxui;
  sunrealtype dcxli;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int idyu;
  int idyl;
  int idxu;
  int idxl;
  int ici;
  int ic;
  int i;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_50;
  int local_4c;
  int local_2c;
  
  lVar7 = N_VGetArrayPointer(in_RDI);
  lVar8 = N_VGetArrayPointer(in_RSI);
  lVar9 = N_VGetArrayPointer(in_RDX);
  iVar3 = in_RCX->ns;
  iVar4 = in_RCX->mxns;
  dVar1 = in_RCX->dx;
  dVar2 = in_RCX->dy;
  for (local_50 = 0; local_50 < 0x14; local_50 = local_50 + 1) {
    local_dc = iVar4;
    if (local_50 == 0x13) {
      local_dc = -iVar4;
    }
    local_e0 = iVar4;
    if (local_50 == 0) {
      local_e0 = -iVar4;
    }
    for (local_4c = 0; local_4c < 0x14; local_4c = local_4c + 1) {
      iVar5 = iVar4 * local_50 + iVar3 * local_4c;
      WebRatesB((double)local_4c * dVar1,(double)local_50 * dVar2,in_XMM0_Qa,
                (sunrealtype *)(lVar7 + (long)iVar5 * 8),(sunrealtype *)(lVar8 + (long)iVar5 * 8),
                in_RCX->fsave + iVar5,in_RCX->fBsave + iVar5,in_RCX);
      local_e4 = iVar3;
      if (local_4c == 0x13) {
        local_e4 = -iVar3;
      }
      local_e8 = iVar3;
      if (local_4c == 0) {
        local_e8 = -iVar3;
      }
      for (local_2c = 1; local_2c <= iVar3; local_2c = local_2c + 1) {
        iVar6 = iVar5 + local_2c + -1;
        *(double *)(lVar9 + (long)iVar6 * 8) =
             (-in_RCX->coy[local_2c + -1] *
              ((*(double *)(lVar8 + (long)(iVar6 + local_dc) * 8) -
               *(double *)(lVar8 + (long)iVar6 * 8)) -
              (*(double *)(lVar8 + (long)iVar6 * 8) -
              *(double *)(lVar8 + (long)(iVar6 - local_e0) * 8))) +
             -(in_RCX->cox[local_2c + -1] *
              ((*(double *)(lVar8 + (long)(iVar6 + local_e4) * 8) -
               *(double *)(lVar8 + (long)iVar6 * 8)) -
              (*(double *)(lVar8 + (long)iVar6 * 8) -
              *(double *)(lVar8 + (long)(iVar6 - local_e8) * 8))))) - in_RCX->fBsave[iVar6];
      }
    }
  }
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici];
      }
    }
  }

  return (0);
}